

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined4 uVar85;
  vint4 bi_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_1;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 bi;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar124;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 ai_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vfloat4 a0_3;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  vfloat4 a0_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar219;
  float fVar220;
  vfloat4 a0;
  undefined1 auVar212 [16];
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0_1;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  uint auStack_178 [4];
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar231 [32];
  
  PVar4 = prim[1];
  uVar27 = (ulong)(byte)PVar4;
  fVar210 = *(float *)(prim + uVar27 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar27 * 0x19 + 6));
  auVar115._0_4_ = fVar210 * auVar35._0_4_;
  auVar115._4_4_ = fVar210 * auVar35._4_4_;
  auVar115._8_4_ = fVar210 * auVar35._8_4_;
  auVar115._12_4_ = fVar210 * auVar35._12_4_;
  auVar42._0_4_ = fVar210 * (ray->dir).field_0.m128[0];
  auVar42._4_4_ = fVar210 * (ray->dir).field_0.m128[1];
  auVar42._8_4_ = fVar210 * (ray->dir).field_0.m128[2];
  auVar42._12_4_ = fVar210 * (ray->dir).field_0.m128[3];
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 4 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 5 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0xb + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar27 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  uVar34 = (ulong)(uint)((int)(uVar27 * 9) * 2);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + uVar27 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  uVar21 = (ulong)(uint)((int)(uVar27 * 5) << 2);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar222._4_4_ = auVar42._0_4_;
  auVar222._0_4_ = auVar42._0_4_;
  auVar222._8_4_ = auVar42._0_4_;
  auVar222._12_4_ = auVar42._0_4_;
  auVar49 = vshufps_avx(auVar42,auVar42,0x55);
  auVar38 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar210 = auVar38._0_4_;
  auVar102._0_4_ = fVar210 * auVar37._0_4_;
  fVar191 = auVar38._4_4_;
  auVar102._4_4_ = fVar191 * auVar37._4_4_;
  fVar203 = auVar38._8_4_;
  auVar102._8_4_ = fVar203 * auVar37._8_4_;
  fVar205 = auVar38._12_4_;
  auVar102._12_4_ = fVar205 * auVar37._12_4_;
  auVar48._0_4_ = auVar45._0_4_ * fVar210;
  auVar48._4_4_ = auVar45._4_4_ * fVar191;
  auVar48._8_4_ = auVar45._8_4_ * fVar203;
  auVar48._12_4_ = auVar45._12_4_ * fVar205;
  auVar86._0_4_ = auVar40._0_4_ * fVar210;
  auVar86._4_4_ = auVar40._4_4_ * fVar191;
  auVar86._8_4_ = auVar40._8_4_ * fVar203;
  auVar86._12_4_ = auVar40._12_4_ * fVar205;
  auVar38 = vfmadd231ps_fma(auVar102,auVar49,auVar36);
  auVar39 = vfmadd231ps_fma(auVar48,auVar49,auVar44);
  auVar49 = vfmadd231ps_fma(auVar86,auVar50,auVar49);
  auVar41 = vfmadd231ps_fma(auVar38,auVar222,auVar35);
  auVar39 = vfmadd231ps_fma(auVar39,auVar222,auVar46);
  auVar42 = vfmadd231ps_fma(auVar49,auVar43,auVar222);
  auVar223._4_4_ = auVar115._0_4_;
  auVar223._0_4_ = auVar115._0_4_;
  auVar223._8_4_ = auVar115._0_4_;
  auVar223._12_4_ = auVar115._0_4_;
  auVar49 = vshufps_avx(auVar115,auVar115,0x55);
  auVar38 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar210 = auVar38._0_4_;
  auVar232._0_4_ = fVar210 * auVar37._0_4_;
  fVar191 = auVar38._4_4_;
  auVar232._4_4_ = fVar191 * auVar37._4_4_;
  fVar203 = auVar38._8_4_;
  auVar232._8_4_ = fVar203 * auVar37._8_4_;
  fVar205 = auVar38._12_4_;
  auVar232._12_4_ = fVar205 * auVar37._12_4_;
  auVar125._0_4_ = auVar45._0_4_ * fVar210;
  auVar125._4_4_ = auVar45._4_4_ * fVar191;
  auVar125._8_4_ = auVar45._8_4_ * fVar203;
  auVar125._12_4_ = auVar45._12_4_ * fVar205;
  auVar116._0_4_ = auVar40._0_4_ * fVar210;
  auVar116._4_4_ = auVar40._4_4_ * fVar191;
  auVar116._8_4_ = auVar40._8_4_ * fVar203;
  auVar116._12_4_ = auVar40._12_4_ * fVar205;
  auVar36 = vfmadd231ps_fma(auVar232,auVar49,auVar36);
  auVar37 = vfmadd231ps_fma(auVar125,auVar49,auVar44);
  auVar44 = vfmadd231ps_fma(auVar116,auVar49,auVar50);
  auVar45 = vfmadd231ps_fma(auVar36,auVar223,auVar35);
  auVar50 = vfmadd231ps_fma(auVar37,auVar223,auVar46);
  auVar69._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar35);
  auVar40 = vfmadd231ps_fma(auVar44,auVar223,auVar43);
  auVar36 = vandps_avx512vl(auVar41,auVar35);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar36,auVar147,1);
  bVar26 = (bool)((byte)uVar34 & 1);
  auVar38._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar41._0_4_;
  bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar41._4_4_;
  bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar41._8_4_;
  bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar41._12_4_;
  auVar36 = vandps_avx512vl(auVar39,auVar35);
  uVar34 = vcmpps_avx512vl(auVar36,auVar147,1);
  bVar26 = (bool)((byte)uVar34 & 1);
  auVar41._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar39._0_4_;
  bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar39._4_4_;
  bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar39._8_4_;
  bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar39._12_4_;
  auVar35 = vandps_avx512vl(auVar42,auVar35);
  uVar34 = vcmpps_avx512vl(auVar35,auVar147,1);
  bVar26 = (bool)((byte)uVar34 & 1);
  auVar39._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._0_4_;
  bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._4_4_;
  bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._8_4_;
  bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar38);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar241 = ZEXT1664(auVar36);
  auVar37 = vfnmadd213ps_avx512vl(auVar38,auVar35,auVar36);
  auVar46 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar41);
  auVar37 = vfnmadd213ps_avx512vl(auVar41,auVar35,auVar36);
  auVar44 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar39);
  auVar36 = vfnmadd213ps_avx512vl(auVar39,auVar35,auVar36);
  auVar43 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar27 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar45);
  auVar134._0_4_ = auVar46._0_4_ * auVar35._0_4_;
  auVar134._4_4_ = auVar46._4_4_ * auVar35._4_4_;
  auVar134._8_4_ = auVar46._8_4_ * auVar35._8_4_;
  auVar134._12_4_ = auVar46._12_4_ * auVar35._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar27 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar36);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar45);
  auVar38 = vpbroadcastd_avx512vl();
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar103._0_4_ = auVar46._0_4_ * auVar35._0_4_;
  auVar103._4_4_ = auVar46._4_4_ * auVar35._4_4_;
  auVar103._8_4_ = auVar46._8_4_ * auVar35._8_4_;
  auVar103._12_4_ = auVar46._12_4_ * auVar35._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar27 * -2 + 6);
  auVar35 = vpmovsxwd_avx(auVar46);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar50);
  auVar148._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar148._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar148._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar148._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar36);
  auVar35 = vsubps_avx(auVar35,auVar50);
  auVar51._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar51._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar51._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar51._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar21 + uVar27 + 6);
  auVar35 = vpmovsxwd_avx(auVar44);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar126._0_4_ = auVar43._0_4_ * auVar35._0_4_;
  auVar126._4_4_ = auVar43._4_4_ * auVar35._4_4_;
  auVar126._8_4_ = auVar43._8_4_ * auVar35._8_4_;
  auVar126._12_4_ = auVar43._12_4_ * auVar35._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar27 * 0x17 + 6);
  auVar35 = vpmovsxwd_avx(auVar45);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar47._0_4_ = auVar43._0_4_ * auVar35._0_4_;
  auVar47._4_4_ = auVar43._4_4_ * auVar35._4_4_;
  auVar47._8_4_ = auVar43._8_4_ * auVar35._8_4_;
  auVar47._12_4_ = auVar43._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar134,auVar103);
  auVar36 = vpminsd_avx(auVar148,auVar51);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar126,auVar47);
  uVar85 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar43._4_4_ = uVar85;
  auVar43._0_4_ = uVar85;
  auVar43._8_4_ = uVar85;
  auVar43._12_4_ = uVar85;
  auVar36 = vmaxps_avx512vl(auVar36,auVar43);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar50._8_4_ = 0x3f7ffffa;
  auVar50._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar50._12_4_ = 0x3f7ffffa;
  local_f8 = vmulps_avx512vl(auVar35,auVar50);
  auVar35 = vpmaxsd_avx(auVar134,auVar103);
  auVar36 = vpmaxsd_avx(auVar148,auVar51);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar126,auVar47);
  fVar210 = ray->tfar;
  auVar40._4_4_ = fVar210;
  auVar40._0_4_ = fVar210;
  auVar40._8_4_ = fVar210;
  auVar40._12_4_ = fVar210;
  auVar36 = vminps_avx512vl(auVar36,auVar40);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar49._8_4_ = 0x3f800003;
  auVar49._0_8_ = 0x3f8000033f800003;
  auVar49._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar49);
  uVar9 = vcmpps_avx512vl(local_f8,auVar35,2);
  uVar34 = vpcmpgtd_avx512vl(auVar38,_DAT_01f7fcf0);
  uVar34 = ((byte)uVar9 & 0xf) & uVar34;
  if ((char)uVar34 == '\0') {
    return false;
  }
  auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar243 = ZEXT1664(auVar69._0_16_);
LAB_01ade5c6:
  lVar23 = 0;
  for (uVar21 = uVar34; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  local_300 = (ulong)*(uint *)(prim + 2);
  local_250 = (ulong)*(uint *)(prim + lVar23 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_300].ptr;
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_250);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var8 + uVar21 * (long)pvVar7);
  auVar36 = *(undefined1 (*) [16])(_Var8 + (uVar21 + 1) * (long)pvVar7);
  auVar37 = *(undefined1 (*) [16])(_Var8 + (uVar21 + 2) * (long)pvVar7);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar21 + 3));
  lVar23 = *(long *)&pGVar5[1].time_range.upper;
  auVar44 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * uVar21);
  auVar45 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar21 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar21 + 2));
  uVar34 = uVar34 - 1 & uVar34;
  auVar50 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar21 + 3));
  if (uVar34 != 0) {
    uVar27 = uVar34 - 1 & uVar34;
    for (uVar21 = uVar34; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    }
    if (uVar27 != 0) {
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar67._16_16_ = auVar69._16_16_;
  auVar86 = auVar243._0_16_;
  auVar38 = vmulps_avx512vl(auVar50,auVar86);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar38);
  auVar87._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar87._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar87._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar87._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar87,auVar44,auVar86);
  auVar67._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar40 = vmulps_avx512vl(auVar50,auVar67._0_16_);
  auVar227._8_4_ = 0x3f000000;
  auVar227._0_8_ = 0x3f0000003f000000;
  auVar227._12_4_ = 0x3f000000;
  auVar40 = vfmadd231ps_fma(auVar40,auVar43,auVar227);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar67._0_16_);
  auVar49 = vfnmadd231ps_fma(auVar40,auVar44,auVar227);
  auVar41 = vmulps_avx512vl(auVar46,auVar86);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar41);
  auVar212._0_4_ = auVar40._0_4_ + auVar36._0_4_;
  auVar212._4_4_ = auVar40._4_4_ + auVar36._4_4_;
  auVar212._8_4_ = auVar40._8_4_ + auVar36._8_4_;
  auVar212._12_4_ = auVar40._12_4_ + auVar36._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar212,auVar35,auVar86);
  auVar40 = vmulps_avx512vl(auVar46,auVar67._0_16_);
  auVar40 = vfmadd231ps_fma(auVar40,auVar37,auVar227);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar67._0_16_);
  auVar40 = vfnmadd231ps_fma(auVar40,auVar35,auVar227);
  auVar104._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar104._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar104._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar104._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar104,auVar45,auVar67._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar86);
  auVar117._0_4_ = auVar50._0_4_ * 0.5;
  auVar117._4_4_ = auVar50._4_4_ * 0.5;
  auVar117._8_4_ = auVar50._8_4_ * 0.5;
  auVar117._12_4_ = auVar50._12_4_ * 0.5;
  auVar43 = vfmadd231ps_avx512vl(auVar117,auVar67._0_16_,auVar43);
  auVar45 = vfnmadd231ps_fma(auVar43,auVar227,auVar45);
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar67._0_16_,auVar44);
  auVar166._0_4_ = auVar41._0_4_ + auVar37._0_4_;
  auVar166._4_4_ = auVar41._4_4_ + auVar37._4_4_;
  auVar166._8_4_ = auVar41._8_4_ + auVar37._8_4_;
  auVar166._12_4_ = auVar41._12_4_ + auVar37._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar166,auVar36,auVar67._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar35,auVar86);
  auVar156._0_4_ = auVar46._0_4_ * 0.5;
  auVar156._4_4_ = auVar46._4_4_ * 0.5;
  auVar156._8_4_ = auVar46._8_4_ * 0.5;
  auVar156._12_4_ = auVar46._12_4_ * 0.5;
  auVar37 = vfmadd231ps_avx512vl(auVar156,auVar67._0_16_,auVar37);
  auVar36 = vfnmadd231ps_fma(auVar37,auVar227,auVar36);
  auVar45 = vfmadd231ps_avx512vl(auVar36,auVar67._0_16_,auVar35);
  auVar35 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar207 = auVar49._0_4_;
  auVar135._0_4_ = fVar207 * auVar36._0_4_;
  fVar208 = auVar49._4_4_;
  auVar135._4_4_ = fVar208 * auVar36._4_4_;
  fVar209 = auVar49._8_4_;
  auVar135._8_4_ = fVar209 * auVar36._8_4_;
  fVar101 = auVar49._12_4_;
  auVar135._12_4_ = fVar101 * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar135,auVar35,auVar42);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar136._0_4_ = fVar207 * auVar36._0_4_;
  auVar136._4_4_ = fVar208 * auVar36._4_4_;
  auVar136._8_4_ = fVar209 * auVar36._8_4_;
  auVar136._12_4_ = fVar101 * auVar36._12_4_;
  auVar35 = vfmsub231ps_fma(auVar136,auVar35,auVar40);
  auVar46 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar36 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar114 = auVar43._0_4_;
  auVar127._0_4_ = fVar114 * auVar36._0_4_;
  fVar122 = auVar43._4_4_;
  auVar127._4_4_ = fVar122 * auVar36._4_4_;
  fVar123 = auVar43._8_4_;
  auVar127._8_4_ = fVar123 * auVar36._8_4_;
  fVar124 = auVar43._12_4_;
  auVar127._12_4_ = fVar124 * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar127,auVar35,auVar44);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar167._0_4_ = auVar36._0_4_ * fVar114;
  auVar167._4_4_ = auVar36._4_4_ * fVar122;
  auVar167._8_4_ = auVar36._8_4_ * fVar123;
  auVar167._12_4_ = auVar36._12_4_ * fVar124;
  auVar35 = vfmsub231ps_fma(auVar167,auVar35,auVar45);
  auVar45 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar191 = auVar35._0_4_;
  auVar52._4_28_ = auVar67._4_28_;
  auVar52._0_4_ = fVar191;
  auVar36 = vrsqrt14ss_avx512f(auVar67._0_16_,auVar52._0_16_);
  fVar210 = auVar36._0_4_;
  fVar210 = fVar210 * 1.5 + fVar191 * -0.5 * fVar210 * fVar210 * fVar210;
  auVar36 = vdpps_avx(auVar37,auVar46,0x7f);
  fVar211 = fVar210 * auVar37._0_4_;
  fVar219 = fVar210 * auVar37._4_4_;
  fVar220 = fVar210 * auVar37._8_4_;
  fVar221 = fVar210 * auVar37._12_4_;
  auVar174._0_4_ = auVar46._0_4_ * fVar191;
  auVar174._4_4_ = auVar46._4_4_ * fVar191;
  auVar174._8_4_ = auVar46._8_4_ * fVar191;
  auVar174._12_4_ = auVar46._12_4_ * fVar191;
  fVar191 = auVar36._0_4_;
  auVar149._0_4_ = fVar191 * auVar37._0_4_;
  auVar149._4_4_ = fVar191 * auVar37._4_4_;
  auVar149._8_4_ = fVar191 * auVar37._8_4_;
  auVar149._12_4_ = fVar191 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar174,auVar149);
  auVar36 = vrcp14ss_avx512f(auVar67._0_16_,auVar52._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar203 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar205 = auVar35._0_4_;
  auVar68._16_16_ = auVar67._16_16_;
  auVar68._0_16_ = auVar67._0_16_;
  auVar53._4_28_ = auVar68._4_28_;
  auVar53._0_4_ = fVar205;
  auVar36 = vrsqrt14ss_avx512f(auVar67._0_16_,auVar53._0_16_);
  fVar191 = auVar36._0_4_;
  fVar191 = fVar191 * 1.5 + fVar205 * -0.5 * fVar191 * fVar191 * fVar191;
  auVar36 = vdpps_avx(auVar44,auVar45,0x7f);
  fVar190 = fVar191 * auVar44._0_4_;
  fVar202 = fVar191 * auVar44._4_4_;
  fVar204 = fVar191 * auVar44._8_4_;
  fVar206 = fVar191 * auVar44._12_4_;
  auVar137._0_4_ = fVar205 * auVar45._0_4_;
  auVar137._4_4_ = fVar205 * auVar45._4_4_;
  auVar137._8_4_ = fVar205 * auVar45._8_4_;
  auVar137._12_4_ = fVar205 * auVar45._12_4_;
  fVar205 = auVar36._0_4_;
  auVar128._0_4_ = fVar205 * auVar44._0_4_;
  auVar128._4_4_ = fVar205 * auVar44._4_4_;
  auVar128._8_4_ = fVar205 * auVar44._8_4_;
  auVar128._12_4_ = fVar205 * auVar44._12_4_;
  auVar46 = vsubps_avx(auVar137,auVar128);
  auVar36 = vrcp14ss_avx512f(auVar67._0_16_,auVar53._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar205 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vshufps_avx(auVar39,auVar39,0xff);
  auVar157._0_4_ = fVar211 * auVar35._0_4_;
  auVar157._4_4_ = fVar219 * auVar35._4_4_;
  auVar157._8_4_ = fVar220 * auVar35._8_4_;
  auVar157._12_4_ = fVar221 * auVar35._12_4_;
  local_1a8 = vsubps_avx(auVar39,auVar157);
  auVar36 = vshufps_avx(auVar49,auVar49,0xff);
  auVar138._0_4_ = auVar36._0_4_ * fVar211 + auVar35._0_4_ * fVar210 * auVar37._0_4_ * fVar203;
  auVar138._4_4_ = auVar36._4_4_ * fVar219 + auVar35._4_4_ * fVar210 * auVar37._4_4_ * fVar203;
  auVar138._8_4_ = auVar36._8_4_ * fVar220 + auVar35._8_4_ * fVar210 * auVar37._8_4_ * fVar203;
  auVar138._12_4_ = auVar36._12_4_ * fVar221 + auVar35._12_4_ * fVar210 * auVar37._12_4_ * fVar203;
  auVar37 = vsubps_avx(auVar49,auVar138);
  local_1b8._0_4_ = auVar39._0_4_ + auVar157._0_4_;
  local_1b8._4_4_ = auVar39._4_4_ + auVar157._4_4_;
  fStack_1b0 = auVar39._8_4_ + auVar157._8_4_;
  fStack_1ac = auVar39._12_4_ + auVar157._12_4_;
  auVar35 = vshufps_avx(auVar38,auVar38,0xff);
  auVar139._0_4_ = fVar190 * auVar35._0_4_;
  auVar139._4_4_ = fVar202 * auVar35._4_4_;
  auVar139._8_4_ = fVar204 * auVar35._8_4_;
  auVar139._12_4_ = fVar206 * auVar35._12_4_;
  local_1c8 = vsubps_avx(auVar38,auVar139);
  auVar36 = vshufps_avx(auVar43,auVar43,0xff);
  auVar96._0_4_ = fVar190 * auVar36._0_4_ + auVar35._0_4_ * fVar191 * auVar46._0_4_ * fVar205;
  auVar96._4_4_ = fVar202 * auVar36._4_4_ + auVar35._4_4_ * fVar191 * auVar46._4_4_ * fVar205;
  auVar96._8_4_ = fVar204 * auVar36._8_4_ + auVar35._8_4_ * fVar191 * auVar46._8_4_ * fVar205;
  auVar96._12_4_ = fVar206 * auVar36._12_4_ + auVar35._12_4_ * fVar191 * auVar46._12_4_ * fVar205;
  auVar35 = vsubps_avx(auVar43,auVar96);
  _local_1d8 = vaddps_avx512vl(auVar38,auVar139);
  auVar105._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar105._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar105._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar105._12_4_ = auVar37._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar105);
  auVar106._0_4_ = auVar35._0_4_ * 0.33333334;
  auVar106._4_4_ = auVar35._4_4_ * 0.33333334;
  auVar106._8_4_ = auVar35._8_4_ * 0.33333334;
  auVar106._12_4_ = auVar35._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar106);
  auVar88._0_4_ = (fVar207 + auVar138._0_4_) * 0.33333334;
  auVar88._4_4_ = (fVar208 + auVar138._4_4_) * 0.33333334;
  auVar88._8_4_ = (fVar209 + auVar138._8_4_) * 0.33333334;
  auVar88._12_4_ = (fVar101 + auVar138._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar88);
  auVar89._0_4_ = (fVar114 + auVar96._0_4_) * 0.33333334;
  auVar89._4_4_ = (fVar122 + auVar96._4_4_) * 0.33333334;
  auVar89._8_4_ = (fVar123 + auVar96._8_4_) * 0.33333334;
  auVar89._12_4_ = (fVar124 + auVar96._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar89);
  aVar1 = (ray->org).field_0;
  auVar36 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar97._4_4_ = uVar85;
  auVar97._0_4_ = uVar85;
  auVar97._8_4_ = uVar85;
  auVar97._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar210 = (pre->ray_space).vz.field_0.m128[0];
  fVar191 = (pre->ray_space).vz.field_0.m128[1];
  fVar203 = (pre->ray_space).vz.field_0.m128[2];
  fVar205 = (pre->ray_space).vz.field_0.m128[3];
  auVar90._0_4_ = fVar210 * auVar36._0_4_;
  auVar90._4_4_ = fVar191 * auVar36._4_4_;
  auVar90._8_4_ = fVar203 * auVar36._8_4_;
  auVar90._12_4_ = fVar205 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar35);
  auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar97);
  auVar36 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar107._4_4_ = uVar85;
  auVar107._0_4_ = uVar85;
  auVar107._8_4_ = uVar85;
  auVar107._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar98._0_4_ = fVar210 * auVar36._0_4_;
  auVar98._4_4_ = fVar191 * auVar36._4_4_;
  auVar98._8_4_ = fVar203 * auVar36._8_4_;
  auVar98._12_4_ = fVar205 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar35);
  auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar107);
  auVar36 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar158._4_4_ = uVar85;
  auVar158._0_4_ = uVar85;
  auVar158._8_4_ = uVar85;
  auVar158._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar108._0_4_ = fVar210 * auVar36._0_4_;
  auVar108._4_4_ = fVar191 * auVar36._4_4_;
  auVar108._8_4_ = fVar203 * auVar36._8_4_;
  auVar108._12_4_ = fVar205 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar3,auVar35);
  auVar43 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar158);
  auVar36 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar168._4_4_ = uVar85;
  auVar168._0_4_ = uVar85;
  auVar168._8_4_ = uVar85;
  auVar168._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar159._0_4_ = fVar210 * auVar36._0_4_;
  auVar159._4_4_ = fVar191 * auVar36._4_4_;
  auVar159._8_4_ = fVar203 * auVar36._8_4_;
  auVar159._12_4_ = fVar205 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar3,auVar35);
  auVar50 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar168);
  auVar36 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar175._4_4_ = uVar85;
  auVar175._0_4_ = uVar85;
  auVar175._8_4_ = uVar85;
  auVar175._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar169._0_4_ = auVar36._0_4_ * fVar210;
  auVar169._4_4_ = auVar36._4_4_ * fVar191;
  auVar169._8_4_ = auVar36._8_4_ * fVar203;
  auVar169._12_4_ = auVar36._12_4_ * fVar205;
  auVar35 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar3,auVar35);
  auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar175);
  auVar36 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar185._4_4_ = uVar85;
  auVar185._0_4_ = uVar85;
  auVar185._8_4_ = uVar85;
  auVar185._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar176._0_4_ = auVar36._0_4_ * fVar210;
  auVar176._4_4_ = auVar36._4_4_ * fVar191;
  auVar176._8_4_ = auVar36._8_4_ * fVar203;
  auVar176._12_4_ = auVar36._12_4_ * fVar205;
  auVar35 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar3,auVar35);
  auVar49 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar185);
  auVar36 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar192._4_4_ = uVar85;
  auVar192._0_4_ = uVar85;
  auVar192._8_4_ = uVar85;
  auVar192._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar186._0_4_ = auVar36._0_4_ * fVar210;
  auVar186._4_4_ = auVar36._4_4_ * fVar191;
  auVar186._8_4_ = auVar36._8_4_ * fVar203;
  auVar186._12_4_ = auVar36._12_4_ * fVar205;
  auVar35 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar35);
  auVar38 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar192);
  auVar36 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar85 = auVar36._0_4_;
  auVar193._4_4_ = uVar85;
  auVar193._0_4_ = uVar85;
  auVar193._8_4_ = uVar85;
  auVar193._12_4_ = uVar85;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar129._0_4_ = fVar210 * auVar36._0_4_;
  auVar129._4_4_ = fVar191 * auVar36._4_4_;
  auVar129._8_4_ = fVar203 * auVar36._8_4_;
  auVar129._12_4_ = fVar205 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar3,auVar35);
  auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar193);
  local_2f8 = vmovlhps_avx512f(auVar44,auVar40);
  auVar244 = ZEXT1664(local_2f8);
  local_318 = vmovlhps_avx512f(auVar45,auVar49);
  auVar242 = ZEXT1664(local_318);
  local_268 = vmovlhps_avx(auVar43,auVar38);
  _local_188 = vmovlhps_avx512f(auVar50,auVar39);
  auVar35 = vminps_avx512vl(local_2f8,local_318);
  auVar37 = vmaxps_avx512vl(local_2f8,local_318);
  auVar36 = vminps_avx512vl(local_268,_local_188);
  auVar36 = vminps_avx(auVar35,auVar36);
  auVar35 = vmaxps_avx512vl(local_268,_local_188);
  auVar35 = vmaxps_avx(auVar37,auVar35);
  auVar37 = vshufpd_avx(auVar36,auVar36,3);
  auVar46 = vshufpd_avx(auVar35,auVar35,3);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar35 = vmaxps_avx(auVar35,auVar46);
  auVar36 = vandps_avx512vl(auVar36,auVar240._0_16_);
  auVar35 = vandps_avx512vl(auVar35,auVar240._0_16_);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  fVar210 = auVar35._0_4_ * 9.536743e-07;
  local_278._8_8_ = auVar44._0_8_;
  local_278._0_8_ = auVar44._0_8_;
  local_288 = vmovddup_avx512vl(auVar45);
  local_298 = vmovddup_avx512vl(auVar43);
  local_2a8._0_8_ = auVar50._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar40._0_8_;
  local_2b8 = auVar40._0_8_;
  register0x00001388 = auVar49._0_8_;
  local_2c8 = auVar49._0_8_;
  register0x00001408 = auVar38._0_8_;
  local_2d8 = auVar38._0_8_;
  register0x00001448 = auVar39._0_8_;
  local_2e8 = auVar39._0_8_;
  local_198 = ZEXT416((uint)fVar210);
  auVar91._4_4_ = fVar210;
  auVar91._0_4_ = fVar210;
  auVar91._8_4_ = fVar210;
  auVar91._12_4_ = fVar210;
  local_78._16_4_ = fVar210;
  local_78._0_16_ = auVar91;
  local_78._20_4_ = fVar210;
  local_78._24_4_ = fVar210;
  local_78._28_4_ = fVar210;
  auVar35 = vxorps_avx512vl(auVar91,auVar86);
  local_98 = auVar35._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  local_c8 = vsubps_avx512vl(local_318,local_2f8);
  local_d8 = vsubps_avx512vl(local_268,local_318);
  local_e8 = vsubps_avx512vl(_local_188,local_268);
  local_108 = vsubps_avx(_local_1b8,local_1a8);
  local_118 = vsubps_avx512vl(_local_208,local_1e8);
  local_128 = vsubps_avx512vl(_local_218,local_1f8);
  _local_138 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar26 = false;
  auVar35 = ZEXT816(0x3f80000000000000);
  uVar21 = 0;
  auVar99 = auVar35;
LAB_01adec83:
  do {
    auVar36 = vshufps_avx(auVar99,auVar99,0x50);
    auVar228._8_4_ = 0x3f800000;
    auVar228._0_8_ = 0x3f8000003f800000;
    auVar228._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._0_16_ = auVar228;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar228,auVar36);
    fVar210 = auVar36._0_4_;
    auVar130._0_4_ = local_2b8._0_4_ * fVar210;
    fVar191 = auVar36._4_4_;
    auVar130._4_4_ = local_2b8._4_4_ * fVar191;
    fVar203 = auVar36._8_4_;
    auVar130._8_4_ = local_2b8._8_4_ * fVar203;
    fVar205 = auVar36._12_4_;
    auVar130._12_4_ = local_2b8._12_4_ * fVar205;
    auVar140._0_4_ = local_2c8._0_4_ * fVar210;
    auVar140._4_4_ = local_2c8._4_4_ * fVar191;
    auVar140._8_4_ = local_2c8._8_4_ * fVar203;
    auVar140._12_4_ = local_2c8._12_4_ * fVar205;
    auVar150._0_4_ = local_2d8._0_4_ * fVar210;
    auVar150._4_4_ = local_2d8._4_4_ * fVar191;
    auVar150._8_4_ = local_2d8._8_4_ * fVar203;
    auVar150._12_4_ = local_2d8._12_4_ * fVar205;
    auVar109._0_4_ = local_2e8._0_4_ * fVar210;
    auVar109._4_4_ = local_2e8._4_4_ * fVar191;
    auVar109._8_4_ = local_2e8._8_4_ * fVar203;
    auVar109._12_4_ = local_2e8._12_4_ * fVar205;
    auVar46 = vfmadd231ps_fma(auVar130,auVar37,local_278);
    auVar44 = vfmadd231ps_avx512vl(auVar140,auVar37,local_288);
    auVar45 = vfmadd231ps_avx512vl(auVar150,auVar37,local_298);
    auVar37 = vfmadd231ps_fma(auVar109,local_2a8,auVar37);
    auVar36 = vmovshdup_avx(auVar35);
    fVar191 = auVar35._0_4_;
    fVar210 = (auVar36._0_4_ - fVar191) * 0.04761905;
    auVar66._4_4_ = fVar191;
    auVar66._0_4_ = fVar191;
    auVar66._8_4_ = fVar191;
    auVar66._12_4_ = fVar191;
    auVar66._16_4_ = fVar191;
    auVar66._20_4_ = fVar191;
    auVar66._24_4_ = fVar191;
    auVar66._28_4_ = fVar191;
    auVar61._0_8_ = auVar36._0_8_;
    auVar61._8_8_ = auVar61._0_8_;
    auVar61._16_8_ = auVar61._0_8_;
    auVar61._24_8_ = auVar61._0_8_;
    auVar69 = vsubps_avx(auVar61,auVar66);
    uVar85 = auVar46._0_4_;
    auVar71._4_4_ = uVar85;
    auVar71._0_4_ = uVar85;
    auVar71._8_4_ = uVar85;
    auVar71._12_4_ = uVar85;
    auVar71._16_4_ = uVar85;
    auVar71._20_4_ = uVar85;
    auVar71._24_4_ = uVar85;
    auVar71._28_4_ = uVar85;
    auVar133._8_4_ = 1;
    auVar133._0_8_ = 0x100000001;
    auVar133._12_4_ = 1;
    auVar133._16_4_ = 1;
    auVar133._20_4_ = 1;
    auVar133._24_4_ = 1;
    auVar133._28_4_ = 1;
    auVar68 = ZEXT1632(auVar46);
    auVar67 = vpermps_avx2(auVar133,auVar68);
    auVar52 = vbroadcastss_avx512vl(auVar44);
    auVar62 = ZEXT1632(auVar44);
    auVar53 = vpermps_avx512vl(auVar133,auVar62);
    auVar54 = vbroadcastss_avx512vl(auVar45);
    auVar63 = ZEXT1632(auVar45);
    auVar55 = vpermps_avx512vl(auVar133,auVar63);
    auVar56 = vbroadcastss_avx512vl(auVar37);
    auVar65 = ZEXT1632(auVar37);
    auVar57 = vpermps_avx512vl(auVar133,auVar65);
    auVar146._4_4_ = fVar210;
    auVar146._0_4_ = fVar210;
    auVar146._8_4_ = fVar210;
    auVar146._12_4_ = fVar210;
    auVar146._16_4_ = fVar210;
    auVar146._20_4_ = fVar210;
    auVar146._24_4_ = fVar210;
    auVar146._28_4_ = fVar210;
    auVar64._8_4_ = 2;
    auVar64._0_8_ = 0x200000002;
    auVar64._12_4_ = 2;
    auVar64._16_4_ = 2;
    auVar64._20_4_ = 2;
    auVar64._24_4_ = 2;
    auVar64._28_4_ = 2;
    auVar58 = vpermps_avx512vl(auVar64,auVar68);
    auVar59 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar60 = vpermps_avx512vl(auVar59,auVar68);
    auVar61 = vpermps_avx512vl(auVar64,auVar62);
    auVar62 = vpermps_avx512vl(auVar59,auVar62);
    auVar68 = vpermps_avx2(auVar64,auVar63);
    auVar63 = vpermps_avx512vl(auVar59,auVar63);
    auVar64 = vpermps_avx512vl(auVar64,auVar65);
    auVar65 = vpermps_avx512vl(auVar59,auVar65);
    auVar36 = vfmadd132ps_fma(auVar69,auVar66,_DAT_01faff20);
    auVar69 = vsubps_avx(auVar231,ZEXT1632(auVar36));
    auVar59 = vmulps_avx512vl(auVar52,ZEXT1632(auVar36));
    auVar70 = ZEXT1632(auVar36);
    auVar66 = vmulps_avx512vl(auVar53,auVar70);
    auVar37 = vfmadd231ps_fma(auVar59,auVar69,auVar71);
    auVar46 = vfmadd231ps_fma(auVar66,auVar69,auVar67);
    auVar59 = vmulps_avx512vl(auVar54,auVar70);
    auVar66 = vmulps_avx512vl(auVar55,auVar70);
    auVar52 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar52);
    auVar53 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar53);
    auVar59 = vmulps_avx512vl(auVar56,auVar70);
    auVar71 = ZEXT1632(auVar36);
    auVar57 = vmulps_avx512vl(auVar57,auVar71);
    auVar59 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar54);
    auVar66 = vfmadd231ps_avx512vl(auVar57,auVar69,auVar55);
    fVar203 = auVar36._0_4_;
    fVar205 = auVar36._4_4_;
    auVar54._4_4_ = fVar205 * auVar52._4_4_;
    auVar54._0_4_ = fVar203 * auVar52._0_4_;
    fVar207 = auVar36._8_4_;
    auVar54._8_4_ = fVar207 * auVar52._8_4_;
    fVar208 = auVar36._12_4_;
    auVar54._12_4_ = fVar208 * auVar52._12_4_;
    auVar54._16_4_ = auVar52._16_4_ * 0.0;
    auVar54._20_4_ = auVar52._20_4_ * 0.0;
    auVar54._24_4_ = auVar52._24_4_ * 0.0;
    auVar54._28_4_ = fVar191;
    auVar55._4_4_ = fVar205 * auVar53._4_4_;
    auVar55._0_4_ = fVar203 * auVar53._0_4_;
    auVar55._8_4_ = fVar207 * auVar53._8_4_;
    auVar55._12_4_ = fVar208 * auVar53._12_4_;
    auVar55._16_4_ = auVar53._16_4_ * 0.0;
    auVar55._20_4_ = auVar53._20_4_ * 0.0;
    auVar55._24_4_ = auVar53._24_4_ * 0.0;
    auVar55._28_4_ = auVar67._28_4_;
    auVar37 = vfmadd231ps_fma(auVar54,auVar69,ZEXT1632(auVar37));
    auVar46 = vfmadd231ps_fma(auVar55,auVar69,ZEXT1632(auVar46));
    auVar70._0_4_ = fVar203 * auVar59._0_4_;
    auVar70._4_4_ = fVar205 * auVar59._4_4_;
    auVar70._8_4_ = fVar207 * auVar59._8_4_;
    auVar70._12_4_ = fVar208 * auVar59._12_4_;
    auVar70._16_4_ = auVar59._16_4_ * 0.0;
    auVar70._20_4_ = auVar59._20_4_ * 0.0;
    auVar70._24_4_ = auVar59._24_4_ * 0.0;
    auVar70._28_4_ = 0;
    auVar57._4_4_ = fVar205 * auVar66._4_4_;
    auVar57._0_4_ = fVar203 * auVar66._0_4_;
    auVar57._8_4_ = fVar207 * auVar66._8_4_;
    auVar57._12_4_ = fVar208 * auVar66._12_4_;
    auVar57._16_4_ = auVar66._16_4_ * 0.0;
    auVar57._20_4_ = auVar66._20_4_ * 0.0;
    auVar57._24_4_ = auVar66._24_4_ * 0.0;
    auVar57._28_4_ = auVar59._28_4_;
    auVar44 = vfmadd231ps_fma(auVar70,auVar69,auVar52);
    auVar45 = vfmadd231ps_fma(auVar57,auVar69,auVar53);
    auVar59._28_4_ = auVar53._28_4_;
    auVar59._0_28_ =
         ZEXT1628(CONCAT412(fVar208 * auVar45._12_4_,
                            CONCAT48(fVar207 * auVar45._8_4_,
                                     CONCAT44(fVar205 * auVar45._4_4_,fVar203 * auVar45._0_4_))));
    auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar208 * auVar44._12_4_,
                                                 CONCAT48(fVar207 * auVar44._8_4_,
                                                          CONCAT44(fVar205 * auVar44._4_4_,
                                                                   fVar203 * auVar44._0_4_)))),
                              auVar69,ZEXT1632(auVar37));
    auVar50 = vfmadd231ps_fma(auVar59,auVar69,ZEXT1632(auVar46));
    auVar67 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar37));
    auVar52 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar46));
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar67 = vmulps_avx512vl(auVar67,auVar53);
    auVar52 = vmulps_avx512vl(auVar52,auVar53);
    auVar72._0_4_ = fVar210 * auVar67._0_4_;
    auVar72._4_4_ = fVar210 * auVar67._4_4_;
    auVar72._8_4_ = fVar210 * auVar67._8_4_;
    auVar72._12_4_ = fVar210 * auVar67._12_4_;
    auVar72._16_4_ = fVar210 * auVar67._16_4_;
    auVar72._20_4_ = fVar210 * auVar67._20_4_;
    auVar72._24_4_ = fVar210 * auVar67._24_4_;
    auVar72._28_4_ = 0;
    auVar67 = vmulps_avx512vl(auVar146,auVar52);
    auVar46 = vxorps_avx512vl(auVar56._0_16_,auVar56._0_16_);
    auVar52 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01feed00,ZEXT1632(auVar46));
    auVar54 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_01feed00,ZEXT1632(auVar46));
    auVar113._0_4_ = auVar72._0_4_ + auVar43._0_4_;
    auVar113._4_4_ = auVar72._4_4_ + auVar43._4_4_;
    auVar113._8_4_ = auVar72._8_4_ + auVar43._8_4_;
    auVar113._12_4_ = auVar72._12_4_ + auVar43._12_4_;
    auVar113._16_4_ = auVar72._16_4_ + 0.0;
    auVar113._20_4_ = auVar72._20_4_ + 0.0;
    auVar113._24_4_ = auVar72._24_4_ + 0.0;
    auVar113._28_4_ = 0;
    auVar66 = ZEXT1632(auVar46);
    auVar55 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,auVar66);
    auVar57 = vaddps_avx512vl(ZEXT1632(auVar50),auVar67);
    auVar59 = vpermt2ps_avx512vl(auVar67,_DAT_01feed00,auVar66);
    auVar67 = vsubps_avx(auVar52,auVar55);
    auVar55 = vsubps_avx512vl(auVar54,auVar59);
    auVar59 = vmulps_avx512vl(auVar61,auVar71);
    auVar56 = vmulps_avx512vl(auVar62,auVar71);
    auVar59 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar58);
    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar60);
    auVar58 = vmulps_avx512vl(auVar68,auVar71);
    auVar60 = vmulps_avx512vl(auVar63,auVar71);
    auVar58 = vfmadd231ps_avx512vl(auVar58,auVar69,auVar61);
    auVar60 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar62);
    auVar61 = vmulps_avx512vl(auVar64,auVar71);
    auVar62 = vmulps_avx512vl(auVar65,auVar71);
    auVar37 = vfmadd231ps_fma(auVar61,auVar69,auVar68);
    auVar68 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar63);
    auVar61 = vmulps_avx512vl(auVar71,auVar58);
    auVar64 = ZEXT1632(auVar36);
    auVar62 = vmulps_avx512vl(auVar64,auVar60);
    auVar59 = vfmadd231ps_avx512vl(auVar61,auVar69,auVar59);
    auVar61 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar56);
    auVar68 = vmulps_avx512vl(auVar64,auVar68);
    auVar58 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar208 * auVar37._12_4_,
                                            CONCAT48(fVar207 * auVar37._8_4_,
                                                     CONCAT44(fVar205 * auVar37._4_4_,
                                                              fVar203 * auVar37._0_4_)))),auVar69,
                         auVar58);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar69,auVar60);
    auVar56._4_4_ = fVar205 * auVar58._4_4_;
    auVar56._0_4_ = fVar203 * auVar58._0_4_;
    auVar56._8_4_ = fVar207 * auVar58._8_4_;
    auVar56._12_4_ = fVar208 * auVar58._12_4_;
    auVar56._16_4_ = auVar58._16_4_ * 0.0;
    auVar56._20_4_ = auVar58._20_4_ * 0.0;
    auVar56._24_4_ = auVar58._24_4_ * 0.0;
    auVar56._28_4_ = auVar63._28_4_;
    auVar60 = vmulps_avx512vl(auVar64,auVar68);
    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar59);
    auVar62 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar69);
    auVar69 = vsubps_avx512vl(auVar58,auVar59);
    auVar68 = vsubps_avx512vl(auVar68,auVar61);
    auVar69 = vmulps_avx512vl(auVar69,auVar53);
    auVar68 = vmulps_avx512vl(auVar68,auVar53);
    fVar191 = fVar210 * auVar69._0_4_;
    fVar203 = fVar210 * auVar69._4_4_;
    auVar58._4_4_ = fVar203;
    auVar58._0_4_ = fVar191;
    fVar205 = fVar210 * auVar69._8_4_;
    auVar58._8_4_ = fVar205;
    fVar207 = fVar210 * auVar69._12_4_;
    auVar58._12_4_ = fVar207;
    fVar208 = fVar210 * auVar69._16_4_;
    auVar58._16_4_ = fVar208;
    fVar209 = fVar210 * auVar69._20_4_;
    auVar58._20_4_ = fVar209;
    fVar210 = fVar210 * auVar69._24_4_;
    auVar58._24_4_ = fVar210;
    auVar58._28_4_ = auVar69._28_4_;
    auVar68 = vmulps_avx512vl(auVar146,auVar68);
    auVar53 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar66);
    auVar59 = vpermt2ps_avx512vl(auVar62,_DAT_01feed00,auVar66);
    auVar189._0_4_ = auVar56._0_4_ + fVar191;
    auVar189._4_4_ = auVar56._4_4_ + fVar203;
    auVar189._8_4_ = auVar56._8_4_ + fVar205;
    auVar189._12_4_ = auVar56._12_4_ + fVar207;
    auVar189._16_4_ = auVar56._16_4_ + fVar208;
    auVar189._20_4_ = auVar56._20_4_ + fVar209;
    auVar189._24_4_ = auVar56._24_4_ + fVar210;
    auVar189._28_4_ = auVar56._28_4_ + auVar69._28_4_;
    auVar69 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,ZEXT1632(auVar46));
    auVar58 = vaddps_avx512vl(auVar62,auVar68);
    auVar68 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,ZEXT1632(auVar46));
    auVar69 = vsubps_avx(auVar53,auVar69);
    auVar68 = vsubps_avx512vl(auVar59,auVar68);
    in_ZMM17 = ZEXT3264(auVar68);
    auVar133 = ZEXT1632(auVar43);
    auVar60 = vsubps_avx512vl(auVar56,auVar133);
    auVar146 = ZEXT1632(auVar50);
    auVar61 = vsubps_avx512vl(auVar62,auVar146);
    auVar63 = vsubps_avx512vl(auVar53,auVar52);
    auVar60 = vaddps_avx512vl(auVar60,auVar63);
    auVar63 = vsubps_avx512vl(auVar59,auVar54);
    auVar61 = vaddps_avx512vl(auVar61,auVar63);
    auVar63 = vmulps_avx512vl(auVar146,auVar60);
    auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar133,auVar61);
    auVar64 = vmulps_avx512vl(auVar57,auVar60);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar113,auVar61);
    auVar65 = vmulps_avx512vl(auVar55,auVar60);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar67,auVar61);
    auVar66 = vmulps_avx512vl(auVar54,auVar60);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar52,auVar61);
    auVar70 = vmulps_avx512vl(auVar62,auVar60);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar56,auVar61);
    auVar71 = vmulps_avx512vl(auVar58,auVar60);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar189,auVar61);
    auVar72 = vmulps_avx512vl(auVar68,auVar60);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar69,auVar61);
    auVar60 = vmulps_avx512vl(auVar59,auVar60);
    auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar53,auVar61);
    auVar61 = vminps_avx512vl(auVar63,auVar64);
    auVar63 = vmaxps_avx512vl(auVar63,auVar64);
    auVar64 = vminps_avx512vl(auVar65,auVar66);
    auVar61 = vminps_avx512vl(auVar61,auVar64);
    auVar64 = vmaxps_avx512vl(auVar65,auVar66);
    auVar63 = vmaxps_avx512vl(auVar63,auVar64);
    auVar64 = vminps_avx512vl(auVar70,auVar71);
    auVar65 = vmaxps_avx512vl(auVar70,auVar71);
    auVar66 = vminps_avx512vl(auVar72,auVar60);
    auVar64 = vminps_avx512vl(auVar64,auVar66);
    auVar61 = vminps_avx512vl(auVar61,auVar64);
    auVar60 = vmaxps_avx512vl(auVar72,auVar60);
    auVar60 = vmaxps_avx512vl(auVar65,auVar60);
    auVar63 = vmaxps_avx512vl(auVar63,auVar60);
    uVar9 = vcmpps_avx512vl(auVar61,local_78,2);
    auVar60._4_4_ = uStack_94;
    auVar60._0_4_ = local_98;
    auVar60._8_4_ = uStack_90;
    auVar60._12_4_ = uStack_8c;
    auVar60._16_4_ = uStack_88;
    auVar60._20_4_ = uStack_84;
    auVar60._24_4_ = uStack_80;
    auVar60._28_4_ = uStack_7c;
    uVar10 = vcmpps_avx512vl(auVar63,auVar60,5);
    bVar19 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar19 != 0) {
      auVar61 = vsubps_avx512vl(auVar52,auVar133);
      auVar63 = vsubps_avx512vl(auVar54,auVar146);
      auVar64 = vsubps_avx512vl(auVar53,auVar56);
      auVar61 = vaddps_avx512vl(auVar61,auVar64);
      auVar64 = vsubps_avx512vl(auVar59,auVar62);
      auVar63 = vaddps_avx512vl(auVar63,auVar64);
      auVar64 = vmulps_avx512vl(auVar146,auVar61);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar63,auVar133);
      auVar57 = vmulps_avx512vl(auVar57,auVar61);
      auVar57 = vfnmadd213ps_avx512vl(auVar113,auVar63,auVar57);
      auVar55 = vmulps_avx512vl(auVar55,auVar61);
      auVar55 = vfnmadd213ps_avx512vl(auVar67,auVar63,auVar55);
      auVar67 = vmulps_avx512vl(auVar54,auVar61);
      auVar54 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar52);
      auVar67 = vmulps_avx512vl(auVar62,auVar61);
      auVar56 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar56);
      auVar67 = vmulps_avx512vl(auVar58,auVar61);
      auVar58 = vfnmadd213ps_avx512vl(auVar189,auVar63,auVar67);
      auVar67 = vmulps_avx512vl(auVar68,auVar61);
      auVar62 = vfnmadd213ps_avx512vl(auVar69,auVar63,auVar67);
      auVar69 = vmulps_avx512vl(auVar59,auVar61);
      auVar59 = vfnmadd231ps_avx512vl(auVar69,auVar53,auVar63);
      auVar67 = vminps_avx(auVar64,auVar57);
      auVar69 = vmaxps_avx(auVar64,auVar57);
      auVar52 = vminps_avx(auVar55,auVar54);
      auVar52 = vminps_avx(auVar67,auVar52);
      auVar67 = vmaxps_avx(auVar55,auVar54);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      auVar68 = vminps_avx(auVar56,auVar58);
      auVar67 = vmaxps_avx(auVar56,auVar58);
      auVar53 = vminps_avx(auVar62,auVar59);
      auVar68 = vminps_avx(auVar68,auVar53);
      auVar68 = vminps_avx(auVar52,auVar68);
      auVar52 = vmaxps_avx(auVar62,auVar59);
      auVar67 = vmaxps_avx(auVar67,auVar52);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      uVar9 = vcmpps_avx512vl(auVar69,auVar60,5);
      uVar10 = vcmpps_avx512vl(auVar68,local_78,2);
      bVar19 = bVar19 & (byte)uVar9 & (byte)uVar10;
      if (bVar19 != 0) {
        auStack_178[uVar21] = (uint)bVar19;
        uVar9 = vmovlps_avx(auVar35);
        (&uStack_b8)[uVar21] = uVar9;
        uVar27 = vmovlps_avx(auVar99);
        auStack_58[uVar21] = uVar27;
        uVar21 = (ulong)((int)uVar21 + 1);
      }
    }
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT3264(auVar69);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar238 = ZEXT1664(auVar35);
    auVar239 = ZEXT3264(_DAT_01feed20);
    auVar69 = _DAT_01feed20;
LAB_01adf18b:
    do {
      do {
        do {
          auVar37 = auVar241._0_16_;
          auVar36 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar21 == 0) {
            if (bVar26) {
              return bVar26;
            }
            fVar210 = ray->tfar;
            auVar17._4_4_ = fVar210;
            auVar17._0_4_ = fVar210;
            auVar17._8_4_ = fVar210;
            auVar17._12_4_ = fVar210;
            uVar9 = vcmpps_avx512vl(local_f8,auVar17,2);
            uVar28 = (uint)uVar34 & (uint)uVar9;
            uVar34 = (ulong)uVar28;
            if (uVar28 == 0) {
              return bVar26;
            }
            goto LAB_01ade5c6;
          }
          uVar20 = (int)uVar21 - 1;
          uVar22 = (ulong)uVar20;
          uVar28 = auStack_178[uVar22];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = auStack_58[uVar22];
          uVar27 = 0;
          for (uVar25 = (ulong)uVar28; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
          {
            uVar27 = uVar27 + 1;
          }
          uVar24 = uVar28 - 1 & uVar28;
          bVar31 = uVar24 == 0;
          auStack_178[uVar22] = uVar24;
          if (bVar31) {
            uVar21 = (ulong)uVar20;
          }
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar27;
          auVar35 = vpunpcklqdq_avx(auVar92,ZEXT416((int)uVar27 + 1));
          auVar35 = vcvtqq2ps_avx512vl(auVar35);
          auVar35 = vmulps_avx512vl(auVar35,auVar238._0_16_);
          uVar85 = *(undefined4 *)((long)&uStack_b8 + uVar22 * 8 + 4);
          auVar11._4_4_ = uVar85;
          auVar11._0_4_ = uVar85;
          auVar11._8_4_ = uVar85;
          auVar11._12_4_ = uVar85;
          auVar46 = vmulps_avx512vl(auVar35,auVar11);
          auVar35 = vsubps_avx512vl(auVar37,auVar35);
          uVar85 = *(undefined4 *)(&uStack_b8 + uVar22);
          auVar12._4_4_ = uVar85;
          auVar12._0_4_ = uVar85;
          auVar12._8_4_ = uVar85;
          auVar12._12_4_ = uVar85;
          auVar35 = vfmadd231ps_avx512vl(auVar46,auVar35,auVar12);
          auVar46 = vmovshdup_avx(auVar35);
          fVar210 = auVar46._0_4_ - auVar35._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar210));
          if (uVar28 == 0 || bVar31) goto LAB_01adec83;
          auVar46 = vshufps_avx(auVar99,auVar99,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar210));
          bVar29 = (uint)uVar21 < 4;
          uVar20 = (uint)uVar21 - 4;
          bVar32 = uVar20 == 0;
          bVar30 = (POPCOUNT(uVar20 & 0xff) & 1U) == 0;
          auVar43 = vsubps_avx512vl(auVar37,auVar46);
          fVar191 = auVar46._0_4_;
          auVar141._0_4_ = fVar191 * (float)local_2b8._0_4_;
          fVar203 = auVar46._4_4_;
          auVar141._4_4_ = fVar203 * (float)local_2b8._4_4_;
          fVar205 = auVar46._8_4_;
          auVar141._8_4_ = fVar205 * fStack_2b0;
          fVar207 = auVar46._12_4_;
          auVar141._12_4_ = fVar207 * fStack_2ac;
          auVar151._0_4_ = fVar191 * (float)local_2c8._0_4_;
          auVar151._4_4_ = fVar203 * (float)local_2c8._4_4_;
          auVar151._8_4_ = fVar205 * fStack_2c0;
          auVar151._12_4_ = fVar207 * fStack_2bc;
          auVar160._0_4_ = fVar191 * (float)local_2d8._0_4_;
          auVar160._4_4_ = fVar203 * (float)local_2d8._4_4_;
          auVar160._8_4_ = fVar205 * fStack_2d0;
          auVar160._12_4_ = fVar207 * fStack_2cc;
          auVar118._0_4_ = fVar191 * (float)local_2e8._0_4_;
          auVar118._4_4_ = fVar203 * (float)local_2e8._4_4_;
          auVar118._8_4_ = fVar205 * fStack_2e0;
          auVar118._12_4_ = fVar207 * fStack_2dc;
          auVar46 = vfmadd231ps_fma(auVar141,auVar43,local_278);
          auVar44 = vfmadd231ps_fma(auVar151,auVar43,local_288);
          auVar45 = vfmadd231ps_fma(auVar160,auVar43,local_298);
          auVar43 = vfmadd231ps_fma(auVar118,auVar43,local_2a8);
          auVar62._16_16_ = auVar46;
          auVar62._0_16_ = auVar46;
          auVar63._16_16_ = auVar44;
          auVar63._0_16_ = auVar44;
          auVar155._16_16_ = auVar45;
          auVar155._0_16_ = auVar45;
          auVar67 = vpermps_avx512vl(auVar239._0_32_,ZEXT1632(auVar35));
          auVar69 = vsubps_avx(auVar63,auVar62);
          auVar44 = vfmadd213ps_fma(auVar69,auVar67,auVar62);
          auVar69 = vsubps_avx(auVar155,auVar63);
          auVar50 = vfmadd213ps_fma(auVar69,auVar67,auVar63);
          auVar46 = vsubps_avx(auVar43,auVar45);
          auVar65._16_16_ = auVar46;
          auVar65._0_16_ = auVar46;
          auVar46 = vfmadd213ps_fma(auVar65,auVar67,auVar155);
          auVar69 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar44));
          auVar44 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar44));
          auVar69 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar50));
          auVar46 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar50));
          auVar69 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar44));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar69,auVar67);
          auVar69 = vmulps_avx512vl(auVar69,auVar237._0_32_);
          auVar46 = vmulss_avx512f(ZEXT416((uint)fVar210),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar191 = auVar46._0_4_;
          auVar161._0_8_ =
               CONCAT44(auVar86._4_4_ + fVar191 * auVar69._4_4_,
                        auVar86._0_4_ + fVar191 * auVar69._0_4_);
          auVar161._8_4_ = auVar86._8_4_ + fVar191 * auVar69._8_4_;
          auVar161._12_4_ = auVar86._12_4_ + fVar191 * auVar69._12_4_;
          auVar142._0_4_ = fVar191 * auVar69._16_4_;
          auVar142._4_4_ = fVar191 * auVar69._20_4_;
          auVar142._8_4_ = fVar191 * auVar69._24_4_;
          auVar142._12_4_ = fVar191 * auVar69._28_4_;
          auVar39 = vsubps_avx((undefined1  [16])0x0,auVar142);
          auVar50 = vshufpd_avx(auVar86,auVar86,3);
          auVar40 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar46 = vsubps_avx(auVar50,auVar86);
          auVar44 = vsubps_avx(auVar40,(undefined1  [16])0x0);
          auVar177._0_4_ = auVar46._0_4_ + auVar44._0_4_;
          auVar177._4_4_ = auVar46._4_4_ + auVar44._4_4_;
          auVar177._8_4_ = auVar46._8_4_ + auVar44._8_4_;
          auVar177._12_4_ = auVar46._12_4_ + auVar44._12_4_;
          auVar46 = vshufps_avx(auVar86,auVar86,0xb1);
          auVar44 = vshufps_avx(auVar161,auVar161,0xb1);
          auVar45 = vshufps_avx(auVar39,auVar39,0xb1);
          auVar43 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar229._4_4_ = auVar177._0_4_;
          auVar229._0_4_ = auVar177._0_4_;
          auVar229._8_4_ = auVar177._0_4_;
          auVar229._12_4_ = auVar177._0_4_;
          auVar49 = vshufps_avx(auVar177,auVar177,0x55);
          fVar191 = auVar49._0_4_;
          auVar187._0_4_ = auVar46._0_4_ * fVar191;
          fVar203 = auVar49._4_4_;
          auVar187._4_4_ = auVar46._4_4_ * fVar203;
          fVar205 = auVar49._8_4_;
          auVar187._8_4_ = auVar46._8_4_ * fVar205;
          fVar207 = auVar49._12_4_;
          auVar187._12_4_ = auVar46._12_4_ * fVar207;
          auVar194._0_4_ = auVar44._0_4_ * fVar191;
          auVar194._4_4_ = auVar44._4_4_ * fVar203;
          auVar194._8_4_ = auVar44._8_4_ * fVar205;
          auVar194._12_4_ = auVar44._12_4_ * fVar207;
          auVar213._0_4_ = auVar45._0_4_ * fVar191;
          auVar213._4_4_ = auVar45._4_4_ * fVar203;
          auVar213._8_4_ = auVar45._8_4_ * fVar205;
          auVar213._12_4_ = auVar45._12_4_ * fVar207;
          auVar178._0_4_ = auVar43._0_4_ * fVar191;
          auVar178._4_4_ = auVar43._4_4_ * fVar203;
          auVar178._8_4_ = auVar43._8_4_ * fVar205;
          auVar178._12_4_ = auVar43._12_4_ * fVar207;
          auVar46 = vfmadd231ps_fma(auVar187,auVar229,auVar86);
          auVar44 = vfmadd231ps_fma(auVar194,auVar229,auVar161);
          auVar41 = vfmadd231ps_fma(auVar213,auVar229,auVar39);
          auVar42 = vfmadd231ps_fma(auVar178,(undefined1  [16])0x0,auVar229);
          auVar49 = vshufpd_avx(auVar46,auVar46,1);
          auVar38 = vshufpd_avx(auVar44,auVar44,1);
          auVar47 = vshufpd_avx512vl(auVar41,auVar41,1);
          auVar48 = vshufpd_avx512vl(auVar42,auVar42,1);
          in_ZMM17 = ZEXT1664(auVar48);
          auVar45 = vminss_avx(auVar46,auVar44);
          auVar46 = vmaxss_avx(auVar44,auVar46);
          auVar43 = vminss_avx(auVar41,auVar42);
          auVar44 = vmaxss_avx(auVar42,auVar41);
          auVar45 = vminss_avx(auVar45,auVar43);
          auVar46 = vmaxss_avx(auVar44,auVar46);
          auVar43 = vminss_avx(auVar49,auVar38);
          auVar44 = vmaxss_avx(auVar38,auVar49);
          auVar49 = vminss_avx512f(auVar47,auVar48);
          auVar38 = vmaxss_avx512f(auVar48,auVar47);
          vmaxss_avx(auVar38,auVar44);
          auVar69._0_16_ = vminss_avx512f(auVar43,auVar49);
          vucomiss_avx512f(auVar45);
          if ((!bVar29 && !bVar32) &&
             (auVar44 = vucomiss_avx512f(auVar36), bVar33 = bVar32, !bVar29 && !bVar32)) break;
          auVar44 = vucomiss_avx512f(auVar36);
          auVar43 = vucomiss_avx512f(auVar69._0_16_);
          auVar46 = vucomiss_avx512f(auVar36);
          bVar33 = bVar29 || bVar32;
          bVar30 = bVar29 || bVar32;
          if (!bVar29 && !bVar32) break;
          uVar9 = vcmpps_avx512vl(auVar45,auVar43,5);
          uVar10 = vcmpps_avx512vl(auVar69._0_16_,auVar43,5);
          uVar20 = (uint)uVar9 & (uint)uVar10;
          bVar18 = (uVar20 & 1) == 0;
          bVar33 = (!bVar29 && !bVar32) && bVar18;
          bVar30 = (!bVar29 && !bVar32) && (uVar20 & 1) == 0;
        } while ((bVar29 || bVar32) || !bVar18);
        auVar49 = vxorps_avx512vl(auVar244._0_16_,auVar244._0_16_);
        vcmpss_avx512f(auVar45,auVar49,1);
        uVar9 = vcmpss_avx512f(auVar46,auVar49,1);
        bVar32 = (bool)((byte)uVar9 & 1);
        auVar74._16_16_ = auVar69._16_16_;
        auVar74._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
        auVar73._4_28_ = auVar74._4_28_;
        auVar73._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
        vucomiss_avx512f(auVar73._0_16_);
        bVar30 = (bool)(!bVar33 | bVar30);
        bVar33 = bVar30 == false;
        auVar76._16_16_ = auVar69._16_16_;
        auVar76._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar75._4_28_ = auVar76._4_28_;
        auVar75._0_4_ = (uint)bVar30 * auVar49._0_4_ + (uint)!bVar30 * 0x7f800000;
        auVar43 = auVar75._0_16_;
        auVar78._16_16_ = auVar69._16_16_;
        auVar78._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)bVar30 * auVar49._0_4_ + (uint)!bVar30 * -0x800000;
        auVar36 = auVar77._0_16_;
        auVar38 = vxorps_avx512vl(auVar242._0_16_,auVar242._0_16_);
        uVar9 = vcmpss_avx512f(auVar69._0_16_,auVar49,1);
        bVar32 = (bool)((byte)uVar9 & 1);
        auVar80._16_16_ = auVar69._16_16_;
        auVar80._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
        auVar79._4_28_ = auVar80._4_28_;
        auVar79._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
        vucomiss_avx512f(auVar79._0_16_);
        if ((bVar30) || (bVar33)) {
          auVar49 = vucomiss_avx512f(auVar45);
          if ((bVar30) || (bVar33)) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar41 = vxorps_avx512vl(auVar45,auVar16);
            auVar45 = vsubss_avx512f(auVar49,auVar45);
            auVar45 = vdivss_avx512f(auVar41,auVar45);
            auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
            auVar69._0_16_ = vfmadd213ss_avx512f(auVar49,auVar38,auVar45);
            auVar45 = auVar69._0_16_;
          }
          else {
            auVar69._0_16_ = vxorps_avx512vl(auVar49,auVar49);
            vucomiss_avx512f(auVar69._0_16_);
            if ((bVar30) || (auVar45 = ZEXT416(0x3f800000), bVar33)) {
              auVar69._0_16_ = ZEXT416(0x7f800000);
              auVar45 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar43 = vminss_avx512f(auVar43,auVar69._0_16_);
          auVar36 = vmaxss_avx(auVar45,auVar36);
        }
        in_ZMM17 = ZEXT464(0x3f800000);
        auVar244 = ZEXT1664(local_2f8);
        auVar242 = ZEXT1664(local_318);
        auVar45 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
        uVar9 = vcmpss_avx512f(auVar44,auVar45,1);
        bVar30 = (bool)((byte)uVar9 & 1);
        auVar49 = in_ZMM17._0_16_;
        fVar191 = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * 0x3f800000);
        if ((auVar73._0_4_ != fVar191) || (NAN(auVar73._0_4_) || NAN(fVar191))) {
          fVar205 = auVar44._0_4_;
          fVar203 = auVar46._0_4_;
          if ((fVar205 != fVar203) || (NAN(fVar205) || NAN(fVar203))) {
            auVar15._8_4_ = 0x80000000;
            auVar15._0_8_ = 0x8000000080000000;
            auVar15._12_4_ = 0x80000000;
            auVar46 = vxorps_avx512vl(auVar46,auVar15);
            auVar179._0_4_ = auVar46._0_4_ / (fVar205 - fVar203);
            auVar179._4_12_ = auVar46._4_12_;
            auVar46 = vsubss_avx512f(auVar49,auVar179);
            auVar46 = vfmadd213ss_avx512f(auVar46,auVar45,auVar179);
            auVar44 = auVar46;
          }
          else if ((fVar203 != 0.0) ||
                  (auVar46 = auVar49, auVar44 = ZEXT816(0) << 0x40, NAN(fVar203))) {
            auVar46 = SUB6416(ZEXT464(0xff800000),0);
            auVar44 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar43 = vminss_avx(auVar43,auVar44);
          auVar36 = vmaxss_avx(auVar46,auVar36);
        }
        bVar30 = auVar79._0_4_ != fVar191;
        auVar46 = vminss_avx512f(auVar43,auVar49);
        auVar82._16_16_ = auVar69._16_16_;
        auVar82._0_16_ = auVar43;
        auVar81._4_28_ = auVar82._4_28_;
        auVar81._0_4_ = (uint)bVar30 * auVar46._0_4_ + (uint)!bVar30 * auVar43._0_4_;
        auVar46 = vmaxss_avx512f(auVar49,auVar36);
        auVar84._16_16_ = auVar69._16_16_;
        auVar84._0_16_ = auVar36;
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar30 * auVar46._0_4_ + (uint)!bVar30 * auVar36._0_4_;
        auVar36 = vmaxss_avx512f(auVar45,auVar81._0_16_);
        auVar69._0_16_ = vminss_avx512f(auVar83._0_16_,auVar49);
      } while (auVar69._0_4_ < auVar36._0_4_);
      auVar45 = vmaxss_avx512f(auVar45,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
      auVar41 = vminss_avx512f(ZEXT416((uint)(auVar69._0_4_ + 0.1)),auVar49);
      auVar119._0_8_ = auVar86._0_8_;
      auVar119._8_8_ = auVar119._0_8_;
      auVar195._8_8_ = auVar161._0_8_;
      auVar195._0_8_ = auVar161._0_8_;
      auVar214._8_8_ = auVar39._0_8_;
      auVar214._0_8_ = auVar39._0_8_;
      auVar36 = vshufpd_avx(auVar161,auVar161,3);
      auVar46 = vshufpd_avx(auVar39,auVar39,3);
      auVar44 = vshufps_avx(auVar45,auVar41,0);
      auVar38 = vsubps_avx512vl(auVar37,auVar44);
      fVar191 = auVar44._0_4_;
      auVar152._0_4_ = fVar191 * auVar50._0_4_;
      fVar203 = auVar44._4_4_;
      auVar152._4_4_ = fVar203 * auVar50._4_4_;
      fVar205 = auVar44._8_4_;
      auVar152._8_4_ = fVar205 * auVar50._8_4_;
      fVar207 = auVar44._12_4_;
      auVar152._12_4_ = fVar207 * auVar50._12_4_;
      auVar162._0_4_ = fVar191 * auVar36._0_4_;
      auVar162._4_4_ = fVar203 * auVar36._4_4_;
      auVar162._8_4_ = fVar205 * auVar36._8_4_;
      auVar162._12_4_ = fVar207 * auVar36._12_4_;
      auVar233._0_4_ = auVar46._0_4_ * fVar191;
      auVar233._4_4_ = auVar46._4_4_ * fVar203;
      auVar233._8_4_ = auVar46._8_4_ * fVar205;
      auVar233._12_4_ = auVar46._12_4_ * fVar207;
      auVar143._0_4_ = fVar191 * auVar40._0_4_;
      auVar143._4_4_ = fVar203 * auVar40._4_4_;
      auVar143._8_4_ = fVar205 * auVar40._8_4_;
      auVar143._12_4_ = fVar207 * auVar40._12_4_;
      auVar43 = vfmadd231ps_fma(auVar152,auVar38,auVar119);
      auVar50 = vfmadd231ps_fma(auVar162,auVar38,auVar195);
      auVar40 = vfmadd231ps_fma(auVar233,auVar38,auVar214);
      auVar38 = vfmadd231ps_fma(auVar143,auVar38,ZEXT816(0));
      auVar46 = vsubss_avx512f(auVar49,auVar45);
      auVar36 = vmovshdup_avx(auVar99);
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar45._0_4_)),auVar99,auVar46);
      auVar46 = vsubss_avx512f(auVar49,auVar41);
      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar41._0_4_)),auVar99,auVar46);
      auVar39 = vdivss_avx512f(auVar49,ZEXT416((uint)fVar210));
      auVar36 = vsubps_avx(auVar50,auVar43);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vmulps_avx512vl(auVar36,auVar41);
      auVar36 = vsubps_avx(auVar40,auVar50);
      auVar45 = vmulps_avx512vl(auVar36,auVar41);
      auVar36 = vsubps_avx(auVar38,auVar40);
      auVar36 = vmulps_avx512vl(auVar36,auVar41);
      auVar46 = vminps_avx(auVar45,auVar36);
      auVar36 = vmaxps_avx(auVar45,auVar36);
      auVar46 = vminps_avx(auVar44,auVar46);
      auVar36 = vmaxps_avx(auVar44,auVar36);
      auVar44 = vshufpd_avx(auVar46,auVar46,3);
      auVar45 = vshufpd_avx(auVar36,auVar36,3);
      auVar46 = vminps_avx(auVar46,auVar44);
      auVar36 = vmaxps_avx(auVar36,auVar45);
      fVar210 = auVar39._0_4_;
      auVar180._0_4_ = auVar46._0_4_ * fVar210;
      auVar180._4_4_ = auVar46._4_4_ * fVar210;
      auVar180._8_4_ = auVar46._8_4_ * fVar210;
      auVar180._12_4_ = auVar46._12_4_ * fVar210;
      auVar170._0_4_ = fVar210 * auVar36._0_4_;
      auVar170._4_4_ = fVar210 * auVar36._4_4_;
      auVar170._8_4_ = fVar210 * auVar36._8_4_;
      auVar170._12_4_ = fVar210 * auVar36._12_4_;
      auVar49 = vdivss_avx512f(auVar49,ZEXT416((uint)(auVar86._0_4_ - auVar42._0_4_)));
      auVar36 = vshufpd_avx(auVar43,auVar43,3);
      auVar46 = vshufpd_avx(auVar50,auVar50,3);
      auVar44 = vshufpd_avx(auVar40,auVar40,3);
      auVar45 = vshufpd_avx(auVar38,auVar38,3);
      auVar36 = vsubps_avx(auVar36,auVar43);
      auVar43 = vsubps_avx(auVar46,auVar50);
      auVar50 = vsubps_avx(auVar44,auVar40);
      auVar45 = vsubps_avx(auVar45,auVar38);
      auVar46 = vminps_avx(auVar36,auVar43);
      auVar36 = vmaxps_avx(auVar36,auVar43);
      auVar44 = vminps_avx(auVar50,auVar45);
      auVar44 = vminps_avx(auVar46,auVar44);
      auVar46 = vmaxps_avx(auVar50,auVar45);
      auVar36 = vmaxps_avx(auVar36,auVar46);
      fVar210 = auVar49._0_4_;
      auVar215._0_4_ = fVar210 * auVar44._0_4_;
      auVar215._4_4_ = fVar210 * auVar44._4_4_;
      auVar215._8_4_ = fVar210 * auVar44._8_4_;
      auVar215._12_4_ = fVar210 * auVar44._12_4_;
      auVar196._0_4_ = fVar210 * auVar36._0_4_;
      auVar196._4_4_ = fVar210 * auVar36._4_4_;
      auVar196._8_4_ = fVar210 * auVar36._8_4_;
      auVar196._12_4_ = fVar210 * auVar36._12_4_;
      auVar45 = vinsertps_avx(auVar35,auVar42,0x10);
      auVar47 = vpermt2ps_avx512vl(auVar35,_DAT_01feecd0,auVar86);
      auVar100._0_4_ = auVar45._0_4_ + auVar47._0_4_;
      auVar100._4_4_ = auVar45._4_4_ + auVar47._4_4_;
      auVar100._8_4_ = auVar45._8_4_ + auVar47._8_4_;
      auVar100._12_4_ = auVar45._12_4_ + auVar47._12_4_;
      auVar13._8_4_ = 0x3f000000;
      auVar13._0_8_ = 0x3f0000003f000000;
      auVar13._12_4_ = 0x3f000000;
      auVar38 = vmulps_avx512vl(auVar100,auVar13);
      auVar46 = vshufps_avx(auVar38,auVar38,0x54);
      uVar85 = auVar38._0_4_;
      auVar110._4_4_ = uVar85;
      auVar110._0_4_ = uVar85;
      auVar110._8_4_ = uVar85;
      auVar110._12_4_ = uVar85;
      auVar43 = vfmadd213ps_avx512vl(local_c8,auVar110,local_2f8);
      auVar50 = vfmadd213ps_avx512vl(local_d8,auVar110,local_318);
      auVar44 = vfmadd213ps_fma(local_e8,auVar110,local_268);
      auVar36 = vsubps_avx(auVar50,auVar43);
      auVar43 = vfmadd213ps_fma(auVar36,auVar110,auVar43);
      auVar36 = vsubps_avx(auVar44,auVar50);
      auVar36 = vfmadd213ps_fma(auVar36,auVar110,auVar50);
      auVar36 = vsubps_avx(auVar36,auVar43);
      auVar44 = vfmadd231ps_fma(auVar43,auVar36,auVar110);
      auVar40 = vmulps_avx512vl(auVar36,auVar41);
      auVar224._8_8_ = auVar44._0_8_;
      auVar224._0_8_ = auVar44._0_8_;
      auVar36 = vshufpd_avx(auVar44,auVar44,3);
      auVar44 = vshufps_avx(auVar38,auVar38,0x55);
      auVar43 = vsubps_avx(auVar36,auVar224);
      auVar50 = vfmadd231ps_fma(auVar224,auVar44,auVar43);
      auVar234._8_8_ = auVar40._0_8_;
      auVar234._0_8_ = auVar40._0_8_;
      auVar36 = vshufpd_avx(auVar40,auVar40,3);
      auVar36 = vsubps_avx512vl(auVar36,auVar234);
      auVar36 = vfmadd213ps_avx512vl(auVar36,auVar44,auVar234);
      auVar44 = vxorps_avx512vl(auVar43,auVar243._0_16_);
      auVar40 = vmovshdup_avx512vl(auVar36);
      auVar49 = vxorps_avx512vl(auVar40,auVar243._0_16_);
      auVar39 = vmovshdup_avx512vl(auVar43);
      auVar242 = ZEXT464(5);
      auVar49 = vpermt2ps_avx512vl(auVar49,ZEXT416(5),auVar43);
      auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar43._0_4_)),auVar36,auVar39);
      auVar44 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar44);
      auVar144._0_4_ = auVar43._0_4_;
      auVar144._4_4_ = auVar144._0_4_;
      auVar144._8_4_ = auVar144._0_4_;
      auVar144._12_4_ = auVar144._0_4_;
      auVar36 = vdivps_avx(auVar49,auVar144);
      auVar48 = vdivps_avx512vl(auVar44,auVar144);
      fVar210 = auVar50._0_4_;
      auVar44 = vshufps_avx(auVar50,auVar50,0x55);
      auVar225._0_4_ = fVar210 * auVar36._0_4_ + auVar44._0_4_ * auVar48._0_4_;
      auVar225._4_4_ = fVar210 * auVar36._4_4_ + auVar44._4_4_ * auVar48._4_4_;
      auVar225._8_4_ = fVar210 * auVar36._8_4_ + auVar44._8_4_ * auVar48._8_4_;
      auVar225._12_4_ = fVar210 * auVar36._12_4_ + auVar44._12_4_ * auVar48._12_4_;
      auVar39 = vsubps_avx(auVar46,auVar225);
      auVar44 = vmovshdup_avx(auVar36);
      auVar46 = vinsertps_avx(auVar180,auVar215,0x1c);
      auVar235._0_4_ = auVar44._0_4_ * auVar46._0_4_;
      auVar235._4_4_ = auVar44._4_4_ * auVar46._4_4_;
      auVar235._8_4_ = auVar44._8_4_ * auVar46._8_4_;
      auVar235._12_4_ = auVar44._12_4_ * auVar46._12_4_;
      auVar41 = vinsertps_avx512f(auVar170,auVar196,0x1c);
      auVar44 = vmulps_avx512vl(auVar44,auVar41);
      auVar49 = vminps_avx512vl(auVar235,auVar44);
      auVar50 = vmaxps_avx(auVar44,auVar235);
      auVar40 = vmovshdup_avx(auVar48);
      auVar44 = vinsertps_avx(auVar215,auVar180,0x4c);
      auVar216._0_4_ = auVar40._0_4_ * auVar44._0_4_;
      auVar216._4_4_ = auVar40._4_4_ * auVar44._4_4_;
      auVar216._8_4_ = auVar40._8_4_ * auVar44._8_4_;
      auVar216._12_4_ = auVar40._12_4_ * auVar44._12_4_;
      auVar43 = vinsertps_avx(auVar196,auVar170,0x4c);
      auVar197._0_4_ = auVar40._0_4_ * auVar43._0_4_;
      auVar197._4_4_ = auVar40._4_4_ * auVar43._4_4_;
      auVar197._8_4_ = auVar40._8_4_ * auVar43._8_4_;
      auVar197._12_4_ = auVar40._12_4_ * auVar43._12_4_;
      auVar40 = vminps_avx(auVar216,auVar197);
      auVar49 = vaddps_avx512vl(auVar49,auVar40);
      auVar40 = vmaxps_avx(auVar197,auVar216);
      auVar198._0_4_ = auVar50._0_4_ + auVar40._0_4_;
      auVar198._4_4_ = auVar50._4_4_ + auVar40._4_4_;
      auVar198._8_4_ = auVar50._8_4_ + auVar40._8_4_;
      auVar198._12_4_ = auVar50._12_4_ + auVar40._12_4_;
      auVar217._8_8_ = 0x3f80000000000000;
      auVar217._0_8_ = 0x3f80000000000000;
      auVar50 = vsubps_avx(auVar217,auVar198);
      auVar40 = vsubps_avx(auVar217,auVar49);
      auVar49 = vsubps_avx(auVar45,auVar38);
      auVar38 = vsubps_avx(auVar47,auVar38);
      fVar207 = auVar49._0_4_;
      auVar236._0_4_ = fVar207 * auVar50._0_4_;
      fVar208 = auVar49._4_4_;
      auVar236._4_4_ = fVar208 * auVar50._4_4_;
      fVar209 = auVar49._8_4_;
      auVar236._8_4_ = fVar209 * auVar50._8_4_;
      fVar101 = auVar49._12_4_;
      auVar236._12_4_ = fVar101 * auVar50._12_4_;
      auVar51 = vbroadcastss_avx512vl(auVar36);
      auVar46 = vmulps_avx512vl(auVar51,auVar46);
      auVar41 = vmulps_avx512vl(auVar51,auVar41);
      auVar51 = vminps_avx512vl(auVar46,auVar41);
      auVar41 = vmaxps_avx512vl(auVar41,auVar46);
      auVar46 = vbroadcastss_avx512vl(auVar48);
      auVar44 = vmulps_avx512vl(auVar46,auVar44);
      auVar46 = vmulps_avx512vl(auVar46,auVar43);
      auVar43 = vminps_avx512vl(auVar44,auVar46);
      auVar43 = vaddps_avx512vl(auVar51,auVar43);
      auVar49 = vmulps_avx512vl(auVar49,auVar40);
      in_ZMM17 = ZEXT1664(auVar49);
      fVar210 = auVar38._0_4_;
      auVar199._0_4_ = fVar210 * auVar50._0_4_;
      fVar191 = auVar38._4_4_;
      auVar199._4_4_ = fVar191 * auVar50._4_4_;
      fVar203 = auVar38._8_4_;
      auVar199._8_4_ = fVar203 * auVar50._8_4_;
      fVar205 = auVar38._12_4_;
      auVar199._12_4_ = fVar205 * auVar50._12_4_;
      auVar218._0_4_ = fVar210 * auVar40._0_4_;
      auVar218._4_4_ = fVar191 * auVar40._4_4_;
      auVar218._8_4_ = fVar203 * auVar40._8_4_;
      auVar218._12_4_ = fVar205 * auVar40._12_4_;
      auVar46 = vmaxps_avx(auVar46,auVar44);
      auVar171._0_4_ = auVar41._0_4_ + auVar46._0_4_;
      auVar171._4_4_ = auVar41._4_4_ + auVar46._4_4_;
      auVar171._8_4_ = auVar41._8_4_ + auVar46._8_4_;
      auVar171._12_4_ = auVar41._12_4_ + auVar46._12_4_;
      auVar181._8_8_ = 0x3f800000;
      auVar181._0_8_ = 0x3f800000;
      auVar46 = vsubps_avx(auVar181,auVar171);
      auVar44 = vsubps_avx512vl(auVar181,auVar43);
      auVar230._0_4_ = fVar207 * auVar46._0_4_;
      auVar230._4_4_ = fVar208 * auVar46._4_4_;
      auVar230._8_4_ = fVar209 * auVar46._8_4_;
      auVar230._12_4_ = fVar101 * auVar46._12_4_;
      auVar226._0_4_ = fVar207 * auVar44._0_4_;
      auVar226._4_4_ = fVar208 * auVar44._4_4_;
      auVar226._8_4_ = fVar209 * auVar44._8_4_;
      auVar226._12_4_ = fVar101 * auVar44._12_4_;
      auVar172._0_4_ = fVar210 * auVar46._0_4_;
      auVar172._4_4_ = fVar191 * auVar46._4_4_;
      auVar172._8_4_ = fVar203 * auVar46._8_4_;
      auVar172._12_4_ = fVar205 * auVar46._12_4_;
      auVar182._0_4_ = fVar210 * auVar44._0_4_;
      auVar182._4_4_ = fVar191 * auVar44._4_4_;
      auVar182._8_4_ = fVar203 * auVar44._8_4_;
      auVar182._12_4_ = fVar205 * auVar44._12_4_;
      auVar46 = vminps_avx(auVar230,auVar226);
      auVar44 = vminps_avx512vl(auVar172,auVar182);
      auVar43 = vminps_avx512vl(auVar46,auVar44);
      auVar46 = vmaxps_avx(auVar226,auVar230);
      auVar44 = vmaxps_avx(auVar182,auVar172);
      auVar44 = vmaxps_avx(auVar44,auVar46);
      auVar50 = vminps_avx512vl(auVar236,auVar49);
      auVar46 = vminps_avx(auVar199,auVar218);
      auVar46 = vminps_avx(auVar50,auVar46);
      auVar46 = vhaddps_avx(auVar43,auVar46);
      auVar69._0_16_ = vmaxps_avx512vl(auVar49,auVar236);
      auVar43 = vmaxps_avx(auVar218,auVar199);
      auVar43 = vmaxps_avx(auVar43,auVar69._0_16_);
      auVar44 = vhaddps_avx(auVar44,auVar43);
      auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
      auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
      auVar173._0_4_ = auVar46._0_4_ + auVar39._0_4_;
      auVar173._4_4_ = auVar46._4_4_ + auVar39._4_4_;
      auVar173._8_4_ = auVar46._8_4_ + auVar39._8_4_;
      auVar173._12_4_ = auVar46._12_4_ + auVar39._12_4_;
      auVar183._0_4_ = auVar44._0_4_ + auVar39._0_4_;
      auVar183._4_4_ = auVar44._4_4_ + auVar39._4_4_;
      auVar183._8_4_ = auVar44._8_4_ + auVar39._8_4_;
      auVar183._12_4_ = auVar44._12_4_ + auVar39._12_4_;
      auVar46 = vmaxps_avx(auVar45,auVar173);
      auVar44 = vminps_avx(auVar183,auVar47);
      uVar27 = vcmpps_avx512vl(auVar44,auVar46,1);
    } while ((uVar27 & 3) != 0);
    uVar27 = vcmpps_avx512vl(auVar183,auVar47,1);
    uVar9 = vcmpps_avx512vl(auVar35,auVar173,1);
    if (((ushort)uVar9 & (ushort)uVar27 & 1) == 0) {
      bVar19 = 0;
    }
    else {
      auVar46 = vmovshdup_avx(auVar173);
      bVar19 = auVar42._0_4_ < auVar46._0_4_ & (byte)(uVar27 >> 1) & 0x7f;
    }
    auVar69._0_16_ = local_318;
    auVar242 = ZEXT1664(local_318);
    if (((!bVar29 || uVar28 != 0 && !bVar31) | bVar19) == 1) {
      lVar23 = 200;
      do {
        fVar205 = auVar39._0_4_;
        fVar203 = 1.0 - fVar205;
        fVar210 = fVar203 * fVar203 * fVar203;
        fVar191 = fVar205 * 3.0 * fVar203 * fVar203;
        fVar203 = fVar203 * fVar205 * fVar205 * 3.0;
        auVar131._4_4_ = fVar210;
        auVar131._0_4_ = fVar210;
        auVar131._8_4_ = fVar210;
        auVar131._12_4_ = fVar210;
        auVar120._4_4_ = fVar191;
        auVar120._0_4_ = fVar191;
        auVar120._8_4_ = fVar191;
        auVar120._12_4_ = fVar191;
        auVar93._4_4_ = fVar203;
        auVar93._0_4_ = fVar203;
        auVar93._8_4_ = fVar203;
        auVar93._12_4_ = fVar203;
        fVar205 = fVar205 * fVar205 * fVar205;
        auVar153._0_4_ = (float)local_188._0_4_ * fVar205;
        auVar153._4_4_ = (float)local_188._4_4_ * fVar205;
        auVar153._8_4_ = fStack_180 * fVar205;
        auVar153._12_4_ = fStack_17c * fVar205;
        auVar35 = vfmadd231ps_fma(auVar153,local_268,auVar93);
        auVar35 = vfmadd231ps_avx512vl(auVar35,local_318,auVar120);
        auVar35 = vfmadd231ps_avx512vl(auVar35,local_2f8,auVar131);
        auVar94._8_8_ = auVar35._0_8_;
        auVar94._0_8_ = auVar35._0_8_;
        auVar35 = vshufpd_avx(auVar35,auVar35,3);
        auVar46 = vshufps_avx(auVar39,auVar39,0x55);
        auVar35 = vsubps_avx(auVar35,auVar94);
        auVar46 = vfmadd213ps_fma(auVar35,auVar46,auVar94);
        fVar210 = auVar46._0_4_;
        auVar35 = vshufps_avx(auVar46,auVar46,0x55);
        auVar95._0_4_ = auVar36._0_4_ * fVar210 + auVar48._0_4_ * auVar35._0_4_;
        auVar95._4_4_ = auVar36._4_4_ * fVar210 + auVar48._4_4_ * auVar35._4_4_;
        auVar95._8_4_ = auVar36._8_4_ * fVar210 + auVar48._8_4_ * auVar35._8_4_;
        auVar95._12_4_ = auVar36._12_4_ * fVar210 + auVar48._12_4_ * auVar35._12_4_;
        auVar39 = vsubps_avx(auVar39,auVar95);
        auVar35 = vandps_avx512vl(auVar46,auVar240._0_16_);
        auVar69._0_16_ = vprolq_avx512vl(auVar35,0x20);
        auVar35 = vmaxss_avx(auVar69._0_16_,auVar35);
        if (auVar35._0_4_ < (float)local_198._0_4_) {
          fVar210 = auVar39._0_4_;
          if ((0.0 <= fVar210) && (fVar210 <= 1.0)) {
            auVar35 = vmovshdup_avx(auVar39);
            fVar191 = auVar35._0_4_;
            if ((0.0 <= fVar191) && (fVar191 <= 1.0)) {
              auVar35 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                      ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar40 = vinsertps_avx(auVar35,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                      0x28);
              aVar1 = (ray->org).field_0;
              auVar35 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
              auVar35 = vdpps_avx(auVar35,auVar40,0x7f);
              auVar36 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
              auVar36 = vdpps_avx(auVar36,auVar40,0x7f);
              auVar46 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
              auVar46 = vdpps_avx(auVar46,auVar40,0x7f);
              auVar44 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
              auVar44 = vdpps_avx(auVar44,auVar40,0x7f);
              auVar45 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
              auVar45 = vdpps_avx(auVar45,auVar40,0x7f);
              auVar43 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
              auVar43 = vdpps_avx(auVar43,auVar40,0x7f);
              auVar50 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
              auVar50 = vdpps_avx(auVar50,auVar40,0x7f);
              auVar49 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
              auVar40 = vdpps_avx(auVar49,auVar40,0x7f);
              fVar203 = 1.0 - fVar191;
              auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar191)),
                                        ZEXT416((uint)fVar203),auVar35);
              auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar191)),
                                        ZEXT416((uint)fVar203),auVar36);
              auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar191)),
                                        ZEXT416((uint)fVar203),auVar46);
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * auVar40._0_4_)),
                                        ZEXT416((uint)fVar203),auVar44);
              fVar207 = 1.0 - fVar210;
              fVar191 = fVar207 * fVar207 * fVar207;
              fVar203 = fVar210 * 3.0 * fVar207 * fVar207;
              fVar205 = fVar207 * fVar210 * fVar210 * 3.0;
              fVar209 = fVar210 * fVar210 * fVar210;
              auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar44._0_4_)),
                                        ZEXT416((uint)fVar205),auVar46);
              auVar36 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar203),auVar36);
              auVar35 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar191),auVar35);
              fVar208 = auVar35._0_4_;
              if (((ray->org).field_0.m128[3] <= fVar208) &&
                 (fVar101 = ray->tfar, fVar208 <= fVar101)) {
                auVar35 = vshufps_avx(auVar39,auVar39,0x55);
                auVar46 = vsubps_avx512vl(auVar37,auVar35);
                fVar114 = auVar35._0_4_;
                auVar184._0_4_ = fVar114 * (float)local_1b8._0_4_;
                fVar122 = auVar35._4_4_;
                auVar184._4_4_ = fVar122 * (float)local_1b8._4_4_;
                fVar123 = auVar35._8_4_;
                auVar184._8_4_ = fVar123 * fStack_1b0;
                fVar124 = auVar35._12_4_;
                auVar184._12_4_ = fVar124 * fStack_1ac;
                auVar188._0_4_ = fVar114 * (float)local_208._0_4_;
                auVar188._4_4_ = fVar122 * (float)local_208._4_4_;
                auVar188._8_4_ = fVar123 * fStack_200;
                auVar188._12_4_ = fVar124 * fStack_1fc;
                auVar200._0_4_ = fVar114 * (float)local_218._0_4_;
                auVar200._4_4_ = fVar122 * (float)local_218._4_4_;
                auVar200._8_4_ = fVar123 * fStack_210;
                auVar200._12_4_ = fVar124 * fStack_20c;
                auVar163._0_4_ = fVar114 * (float)local_1d8._0_4_;
                auVar163._4_4_ = fVar122 * (float)local_1d8._4_4_;
                auVar163._8_4_ = fVar123 * fStack_1d0;
                auVar163._12_4_ = fVar124 * fStack_1cc;
                auVar35 = vfmadd231ps_fma(auVar184,auVar46,local_1a8);
                auVar36 = vfmadd231ps_fma(auVar188,auVar46,local_1e8);
                auVar37 = vfmadd231ps_fma(auVar200,auVar46,local_1f8);
                auVar46 = vfmadd231ps_fma(auVar163,auVar46,local_1c8);
                auVar35 = vsubps_avx(auVar36,auVar35);
                auVar36 = vsubps_avx(auVar37,auVar36);
                auVar37 = vsubps_avx(auVar46,auVar37);
                auVar201._0_4_ = fVar210 * auVar36._0_4_;
                auVar201._4_4_ = fVar210 * auVar36._4_4_;
                auVar201._8_4_ = fVar210 * auVar36._8_4_;
                auVar201._12_4_ = fVar210 * auVar36._12_4_;
                auVar154._4_4_ = fVar207;
                auVar154._0_4_ = fVar207;
                auVar154._8_4_ = fVar207;
                auVar154._12_4_ = fVar207;
                auVar35 = vfmadd231ps_fma(auVar201,auVar154,auVar35);
                auVar164._0_4_ = fVar210 * auVar37._0_4_;
                auVar164._4_4_ = fVar210 * auVar37._4_4_;
                auVar164._8_4_ = fVar210 * auVar37._8_4_;
                auVar164._12_4_ = fVar210 * auVar37._12_4_;
                auVar36 = vfmadd231ps_fma(auVar164,auVar154,auVar36);
                auVar165._0_4_ = fVar210 * auVar36._0_4_;
                auVar165._4_4_ = fVar210 * auVar36._4_4_;
                auVar165._8_4_ = fVar210 * auVar36._8_4_;
                auVar165._12_4_ = fVar210 * auVar36._12_4_;
                auVar35 = vfmadd231ps_fma(auVar165,auVar154,auVar35);
                auVar14._8_4_ = 0x40400000;
                auVar14._0_8_ = 0x4040000040400000;
                auVar14._12_4_ = 0x40400000;
                auVar69._0_16_ = vmulps_avx512vl(auVar35,auVar14);
                pGVar5 = (context->scene->geometries).items[local_300].ptr;
                if ((pGVar5->mask & ray->mask) == 0) {
LAB_01adff89:
                  bVar19 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar19 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar145._0_4_ = fVar209 * (float)local_138._0_4_;
                  auVar145._4_4_ = fVar209 * (float)local_138._4_4_;
                  auVar145._8_4_ = fVar209 * fStack_130;
                  auVar145._12_4_ = fVar209 * fStack_12c;
                  auVar132._4_4_ = fVar205;
                  auVar132._0_4_ = fVar205;
                  auVar132._8_4_ = fVar205;
                  auVar132._12_4_ = fVar205;
                  auVar35 = vfmadd132ps_fma(auVar132,auVar145,local_128);
                  auVar121._4_4_ = fVar203;
                  auVar121._0_4_ = fVar203;
                  auVar121._8_4_ = fVar203;
                  auVar121._12_4_ = fVar203;
                  auVar35 = vfmadd132ps_fma(auVar121,auVar35,local_118);
                  auVar111._4_4_ = fVar191;
                  auVar111._0_4_ = fVar191;
                  auVar111._8_4_ = fVar191;
                  auVar111._12_4_ = fVar191;
                  auVar37 = vfmadd132ps_fma(auVar111,auVar35,local_108);
                  auVar35 = vshufps_avx(auVar37,auVar37,0xc9);
                  auVar36 = vshufps_avx(auVar69._0_16_,auVar69._0_16_,0xc9);
                  auVar112._0_4_ = auVar37._0_4_ * auVar36._0_4_;
                  auVar112._4_4_ = auVar37._4_4_ * auVar36._4_4_;
                  auVar112._8_4_ = auVar37._8_4_ * auVar36._8_4_;
                  auVar112._12_4_ = auVar37._12_4_ * auVar36._12_4_;
                  auVar36 = vfmsub231ps_fma(auVar112,auVar69._0_16_,auVar35);
                  auVar35 = vshufps_avx(auVar36,auVar36,0xe9);
                  local_168 = vmovlps_avx(auVar35);
                  local_160 = auVar36._0_4_;
                  local_15c = vmovlps_avx(auVar39);
                  local_154 = (int)local_250;
                  local_150 = (int)local_300;
                  local_14c = context->user->instID[0];
                  local_148 = context->user->instPrimID[0];
                  ray->tfar = fVar208;
                  local_31c = -1;
                  local_248.valid = &local_31c;
                  local_248.geometryUserPtr = pGVar5->userPtr;
                  local_248.context = context->user;
                  local_248.hit = (RTCHitN *)&local_168;
                  local_248.N = 1;
                  local_248.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&local_248);
                    auVar239 = ZEXT3264(_DAT_01feed20);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar238 = ZEXT1664(auVar35);
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar237 = ZEXT3264(auVar69);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar243 = ZEXT1664(auVar35);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar241 = ZEXT1664(auVar35);
                    auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar240 = ZEXT1664(auVar69._0_16_);
                    if (*local_248.valid != 0) goto LAB_01adfebd;
LAB_01adff7d:
                    ray->tfar = fVar101;
                    goto LAB_01adff89;
                  }
LAB_01adfebd:
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&local_248);
                    auVar239 = ZEXT3264(_DAT_01feed20);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar238 = ZEXT1664(auVar35);
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar237 = ZEXT3264(auVar69);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar243 = ZEXT1664(auVar35);
                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar241 = ZEXT1664(auVar35);
                    auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar240 = ZEXT1664(auVar69._0_16_);
                    if (*local_248.valid == 0) goto LAB_01adff7d;
                  }
                  bVar19 = 1;
                }
                bVar26 = (bool)(bVar26 | bVar19);
              }
            }
          }
          break;
        }
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      goto LAB_01adf18b;
    }
    auVar99 = vinsertps_avx(auVar42,auVar86,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }